

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void codearith(FuncState *fs,OpCode op,expdesc *e1,expdesc *e2,int line)

{
  double v2;
  expdesc *e;
  int iVar1;
  int b;
  expdesc *e_00;
  lua_Number lVar2;
  
  iVar1 = isnumeral(e1);
  if (((iVar1 == 0) || (iVar1 = isnumeral(e2), iVar1 == 0)) ||
     ((v2 = (e2->u).nval, (op & ~OP_LOADK) == OP_DIV && ((v2 == 0.0 && (!NAN(v2))))))) {
    iVar1 = 0;
    if ((op != OP_UNM) && (iVar1 = 0, op != OP_LEN)) {
      iVar1 = luaK_exp2RK(fs,e2);
    }
    b = luaK_exp2RK(fs,e1);
    e_00 = e2;
    e = e1;
    if (b <= iVar1) {
      e_00 = e1;
      e = e2;
    }
    freeexp(fs,e);
    freeexp(fs,e_00);
    iVar1 = luaK_codeABC(fs,op,0,b,iVar1);
    (e1->u).info = iVar1;
    e1->k = VRELOCABLE;
    fs->f->lineinfo[(long)fs->pc + -1] = line;
  }
  else {
    lVar2 = luaO_arith(op - OP_ADD,(e1->u).nval,v2);
    (e1->u).nval = lVar2;
  }
  return;
}

Assistant:

static void codearith (FuncState *fs, OpCode op,
                       expdesc *e1, expdesc *e2, int line) {
  if (constfolding(op, e1, e2))
    return;
  else {
    int o2 = (op != OP_UNM && op != OP_LEN) ? luaK_exp2RK(fs, e2) : 0;
    int o1 = luaK_exp2RK(fs, e1);
    if (o1 > o2) {
      freeexp(fs, e1);
      freeexp(fs, e2);
    }
    else {
      freeexp(fs, e2);
      freeexp(fs, e1);
    }
    e1->u.info = luaK_codeABC(fs, op, 0, o1, o2);
    e1->k = VRELOCABLE;
    luaK_fixline(fs, line);
  }
}